

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::writeOp<(moira::Core)2,(moira::Mode)4,1,0ull>(Moira *this,int n,u32 val)

{
  int *piVar1;
  u32 addr;
  
  this->writeBuffer = (u16)val;
  addr = computeEA<(moira::Core)2,(moira::Mode)4,1,0ull>(this,n);
  piVar1 = (int *)((long)&(this->reg).field_3 + (long)n * 4 + 0x20);
  *piVar1 = *piVar1 + ~(uint)(n == 7);
  write<(moira::Core)2,(moira::AddrSpace)1,1,0ull>(this,addr,val);
  return;
}

Assistant:

void
Moira::writeOp(int n, u32 val)
{
    switch (M) {

        case Mode::DN: writeD<S>(n, val); break;
        case Mode::AN: writeA<S>(n, val); break;
        case Mode::IM: fatalError;

        default:

            writeBuffer = (S == Long) ? u16(val >> 16) : u16(val & 0xFFFF);

            // Compute effective address
            u32 ea = computeEA<C, M, S>(n);

            // Emulate -(An) register modification
            updateAnPD<M, S>(n);

            // Write to effective address
            writeM<C, M, S, F>(ea, val);

            // Emulate (An)+ register modification
            updateAnPI<M, S>(n);
    }
}